

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O2

void anon_unknown.dwarf_14272::_create_window_with_message_loop
               (WindowHandle user_data,string *title,int x,int y,int w,int h)

{
  IWindowListener *pIVar1;
  undefined4 TgtWidth;
  undefined4 TgtHeight;
  int iVar2;
  Display *pDVar3;
  Window WVar4;
  GC p_Var5;
  Pixmap PVar6;
  char *pcVar7;
  XImage *pXVar8;
  long lVar9;
  long lVar10;
  mutex *__mutex;
  long lVar11;
  size_t __size;
  long lVar12;
  double dVar13;
  Atom wmDeleteMessage;
  XEvent ev;
  XEvent nev;
  
  __mutex = &user_data->mt;
  std::mutex::lock(__mutex);
  pDVar3 = (Display *)XOpenDisplay(0);
  user_data->display = pDVar3;
  lVar9 = *(long *)(pDVar3 + 0xe8);
  lVar12 = (long)*(int *)(pDVar3 + 0xe0) * 0x80;
  WVar4 = XCreateSimpleWindow(pDVar3,*(undefined8 *)(lVar9 + 0x10 + lVar12),x,y,w,h,2,
                              *(undefined8 *)(lVar9 + 0x60 + lVar12),
                              *(undefined8 *)(lVar9 + 0x58 + lVar12));
  user_data->win = WVar4;
  pDVar3 = user_data->display;
  user_data->visual = *(Visual **)(*(long *)(pDVar3 + 0xe8) + 0x40 + lVar12);
  iVar2 = *(int *)(pDVar3 + 0xe0);
  p_Var5 = (GC)XCreateGC(pDVar3,WVar4,0,&ev);
  XSetForeground(pDVar3,p_Var5,*(undefined8 *)(*(long *)(pDVar3 + 0xe8) + 0x60 + (long)iVar2 * 0x80)
                );
  XSetBackground(pDVar3,p_Var5,*(undefined8 *)(*(long *)(pDVar3 + 0xe8) + 0x58 + (long)iVar2 * 0x80)
                );
  XSetLineAttributes(pDVar3,p_Var5,2,0,1,2);
  XSetFillStyle(pDVar3,p_Var5,0);
  user_data->gc = p_Var5;
  XStoreName(user_data->display,user_data->win,(title->_M_dataplus)._M_p);
  XMapWindow(user_data->display,user_data->win);
  XSync(user_data->display,0);
  XSelectInput(user_data->display,user_data->win,0x28003);
  pDVar3 = user_data->display;
  PVar6 = XCreatePixmap(pDVar3,*(undefined8 *)
                                (*(long *)(pDVar3 + 0xe8) + 0x10 +
                                (long)*(int *)(pDVar3 + 0xe0) * 0x80),w,h,
                        *(undefined4 *)(*(long *)(pDVar3 + 0xe8) + 0x38 + lVar12));
  user_data->pix = PVar6;
  user_data->pix_w = w;
  user_data->pix_h = h;
  pcVar7 = (char *)calloc(1,(long)w * (long)h * 4);
  user_data->data = pcVar7;
  pXVar8 = (XImage *)
           XCreateImage(user_data->display,user_data->visual,
                        *(undefined4 *)(*(long *)(user_data->display + 0xe8) + 0x38 + lVar12),2,0,
                        pcVar7,(long)w,(long)h,0x20,0);
  user_data->im = pXVar8;
  XPutImage(user_data->display,user_data->pix,user_data->gc,pXVar8,0,0,0,0,user_data->pix_w,
            user_data->pix_h);
  wmDeleteMessage = XInternAtom(user_data->display,"WM_DELETE_WINDOW",0);
  XSetWMProtocols(user_data->display,user_data->win,&wmDeleteMessage,1);
  LOCK();
  (user_data->quit)._M_base._M_i = false;
  UNLOCK();
  user_data->initialised = true;
  std::condition_variable::notify_all();
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  do {
    if (((user_data->quit)._M_base._M_i & 1U) != 0) {
      return;
    }
    lVar9 = std::chrono::_V2::system_clock::now();
LAB_00105b5a:
    if (user_data->display != (Display *)0x0) {
      iVar2 = XPending();
      if (iVar2 == 0) goto LAB_00105e19;
      XNextEvent(user_data->display,&ev);
      TgtHeight = ev.xgraphicsexpose.major_code;
      TgtWidth = ev.xexpose.count;
      if (ev.type == 2) {
        pIVar1 = user_data->listener;
        if (pIVar1 != (IWindowListener *)0x0) {
          (**(code **)(*(long *)pIVar1 + 8))(pIVar1,ev.xkey.keycode);
        }
      }
      else {
        if (ev.type != 3) {
          if (ev.type == 0x21) {
            std::mutex::lock(__mutex);
            LOCK();
            (user_data->quit)._M_base._M_i = true;
            UNLOCK();
            if (user_data->listener != (IWindowListener *)0x0) {
              (*(code *)**(undefined8 **)user_data->listener)();
            }
            (*(user_data->im->f).destroy_image)(user_data->im);
            XFreePixmap(user_data->display,user_data->pix);
            XCloseDisplay(user_data->display);
            user_data->display = (Display *)0x0;
            user_data->listener = (IWindowListener *)0x0;
          }
          else {
            if (ev.type == 0x16) {
              if ((ev.xexpose.count != user_data->pix_w) ||
                 (ev.xgraphicsexpose.major_code != user_data->pix_h)) {
                lVar10 = (long)ev.xexpose.count;
                lVar11 = (long)ev.xgraphicsexpose.major_code;
                std::mutex::lock(__mutex);
                XFreePixmap(user_data->display,user_data->pix);
                (*(user_data->im->f).destroy_image)(user_data->im);
                __size = lVar11 * lVar10 * 4;
                pcVar7 = (char *)malloc(__size);
                user_data->data = pcVar7;
                pXVar8 = (XImage *)
                         XCreateImage(user_data->display,user_data->visual,
                                      *(undefined4 *)
                                       (*(long *)(user_data->display + 0xe8) + 0x38 + lVar12),2,0,
                                      pcVar7,TgtWidth,TgtHeight,0x20,0);
                user_data->im = pXVar8;
                pDVar3 = user_data->display;
                PVar6 = XCreatePixmap(pDVar3,*(undefined8 *)
                                              (*(long *)(pDVar3 + 0xe8) + 0x10 +
                                              (long)*(int *)(pDVar3 + 0xe0) * 0x80),TgtWidth,
                                      TgtHeight,
                                      *(undefined4 *)(*(long *)(pDVar3 + 0xe8) + 0x38 + lVar12));
                user_data->pix = PVar6;
                user_data->pix_w = TgtWidth;
                user_data->pix_h = TgtHeight;
                if ((user_data->w == 0) || (user_data->h == 0)) {
                  memset(user_data->data,0,__size);
                }
                else {
                  _scale((uint32_t *)user_data->data,TgtWidth,TgtHeight,user_data->bytes,
                         user_data->w,user_data->h);
                }
                XPutImage(user_data->display,user_data->pix,user_data->gc,user_data->im,0,0,0,0,
                          user_data->pix_w,user_data->pix_h);
                XFlush(user_data->display);
                pthread_mutex_unlock((pthread_mutex_t *)__mutex);
              }
              goto LAB_00105b5a;
            }
            if (ev.type != 0xc) goto LAB_00105b5a;
            std::mutex::lock(__mutex);
            XCopyArea(user_data->display,user_data->pix,user_data->win,user_data->gc,0,0,
                      user_data->pix_w,user_data->pix_h,0,0);
          }
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
          goto LAB_00105b5a;
        }
        iVar2 = XEventsQueued(user_data->display,1);
        if (iVar2 != 0) {
          XPeekEvent(user_data->display,&nev);
          if (((nev.type == 2) &&
              (nev.xkey.time == CONCAT44(ev.xgraphicsexpose.major_code,ev.xexpose.count))) &&
             (nev.xkey.keycode == ev.xkey.keycode)) {
            XNextEvent(user_data->display,&ev);
            goto LAB_00105b5a;
          }
        }
        pIVar1 = user_data->listener;
        if (pIVar1 != (IWindowListener *)0x0) {
          (**(code **)(*(long *)pIVar1 + 0x10))(pIVar1,ev.xkey.keycode);
        }
      }
      goto LAB_00105b5a;
    }
LAB_00105e19:
    lVar10 = std::chrono::_V2::system_clock::now();
    dVar13 = (double)(lVar10 - lVar9) / 1000.0;
    if (dVar13 < 1000.0) {
      ev.pad[0] = (long)(1000.0 - dVar13);
      std::this_thread::sleep_for<double,std::ratio<1l,1000000l>>
                ((duration<double,_std::ratio<1L,_1000000L>_> *)&ev.xany);
    }
  } while( true );
}

Assistant:

void _create_window_with_message_loop(WindowHandle user_data, const std::string& title, int x, int y, int w, int h)
    {
    user_data->mt.lock();
    user_data->display = XOpenDisplay(0);
    int screen_num = DefaultScreen(user_data->display);

    user_data->win = XCreateSimpleWindow(user_data->display, RootWindow(user_data->display, screen_num),
      x, y, w, h, 2, BlackPixel(user_data->display, screen_num),
      WhitePixel(user_data->display, screen_num));

    user_data->visual = DefaultVisual(user_data->display, screen_num);
    user_data->gc = create_gc(user_data->display, user_data->win, 0);

    XStoreName(user_data->display, user_data->win, title.c_str());
    XMapWindow(user_data->display, user_data->win);
    XSync(user_data->display, False);
    XSelectInput(user_data->display, user_data->win, ExposureMask | StructureNotifyMask | KeyPressMask | KeyReleaseMask); // Set the events we want to receive
    
    user_data->pix = XCreatePixmap(user_data->display, DefaultRootWindow(user_data->display), w, h, DefaultDepth(user_data->display, screen_num)); // Pixmap for off-screen rendering
    user_data->pix_w = w;
    user_data->pix_h = h;
    
    user_data->data = (char*)malloc(sizeof(uint8_t)*w*h * 4); // Pointer to memory for off-screen rendering
    memset(user_data->data, 0, sizeof(uint8_t)*w*h * 4); // Initialize to black
    user_data->im = XCreateImage(user_data->display, user_data->visual, DefaultDepth(user_data->display, screen_num), ZPixmap, 0, user_data->data, w, h, 32, 0); // Container for user_data->data
    XPutImage(user_data->display, user_data->pix, user_data->gc, user_data->im, 0, 0, 0, 0, user_data->pix_w, user_data->pix_h); // Draw the XImage on the Pixmap
    
    Atom wmDeleteMessage = XInternAtom(user_data->display, "WM_DELETE_WINDOW", False); // When the close button is pressed, the window manager should send this to us as a event (ClientMessage).
    XSetWMProtocols(user_data->display, user_data->win, &wmDeleteMessage, 1);   
    
    user_data->quit = false;
    user_data->initialised = true;
    user_data->cv.notify_all();
    user_data->mt.unlock();

    while (!user_data->quit)
      {
      auto tic = std::chrono::high_resolution_clock::now();
      while (user_data->display && XPending(user_data->display))
        {
        XEvent ev;
        XNextEvent(user_data->display, &ev);
        //printf("event type: %d\n", ev.type); 
        switch (ev.type)
          {
          case Expose:
          {
          user_data->mt.lock();
          XCopyArea(user_data->display, user_data->pix, user_data->win, user_data->gc, 0, 0, user_data->pix_w, user_data->pix_h, 0, 0); // Copy the pixmap to the window for on-screen rendering.
          user_data->mt.unlock();
          break;
          }
          case KeyPress:
          {
          if (user_data->listener)
            user_data->listener->OnKeyDown(ev.xkey.keycode);
          break;
          }
          case KeyRelease:
          {
          unsigned short is_retriggered = 0;
          
          if (XEventsQueued(user_data->display, QueuedAfterReading))
            {
            XEvent nev;
            XPeekEvent(user_data->display, &nev);
            
            if (nev.type == KeyPress && nev.xkey.time == ev.xkey.time && nev.xkey.keycode == ev.xkey.keycode)
              {
              XNextEvent(user_data->display, &ev);
              is_retriggered = 1;
              }
            }
          
          
          if (!is_retriggered && user_data->listener)
            user_data->listener->OnKeyUp(ev.xkey.keycode);
          break;
          }
          case ClientMessage:
          {
          user_data->mt.lock();
          user_data->quit = true;
          if (user_data->listener)
            user_data->listener->OnClose();
          XDestroyImage(user_data->im);
          XFreePixmap(user_data->display, user_data->pix);
          XCloseDisplay(user_data->display);
          user_data->display = nullptr;
          user_data->listener = nullptr;
          user_data->mt.unlock();
          break;
          }
          case ConfigureNotify:
          {
          XConfigureEvent xce = ev.xconfigure;
          if (xce.width != user_data->pix_w || xce.height != user_data->pix_h)
            {
            user_data->mt.lock();
            XFreePixmap(user_data->display, user_data->pix); // Free pixmap  
            XDestroyImage(user_data->im); // Free XImage (and user_data->data)
            user_data->data = (char*)malloc(sizeof(uint8_t)*xce.width*xce.height * 4); // Allocate new memory
            user_data->im = XCreateImage(user_data->display, user_data->visual, DefaultDepth(user_data->display, screen_num), ZPixmap, 0, user_data->data, xce.width, xce.height, 32, 0);   // Create container for user_data->data as XImage.
            user_data->pix = XCreatePixmap(user_data->display, DefaultRootWindow(user_data->display), xce.width, xce.height, DefaultDepth(user_data->display, screen_num)); // Create Pixmap
            user_data->pix_w = xce.width;
            user_data->pix_h = xce.height;
            if (user_data->w && user_data->h)
              _scale((uint32_t*)user_data->data, user_data->pix_w, user_data->pix_h, (uint32_t*)user_data->bytes, user_data->w, user_data->h); // Mipmap user bitmap (user_data->bytes) to screen bitmap
            else
              memset(user_data->data, 0, sizeof(uint8_t)*xce.width*xce.height * 4);
            XPutImage(user_data->display, user_data->pix, user_data->gc, user_data->im, 0, 0, 0, 0, user_data->pix_w, user_data->pix_h); // Copy XImage to Pixmap
            XFlush(user_data->display);
            user_data->mt.unlock();            
            }
          break;
          }
          default: break;
          }
        }
      auto toc = std::chrono::high_resolution_clock::now();
      const std::chrono::duration<double, std::micro> time_elapsed = (toc-tic);
      if (time_elapsed < std::chrono::duration<double, std::micro>(1000))
        std::this_thread::sleep_for(std::chrono::duration<double, std::micro>(1000)-time_elapsed);
      }
    }